

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableMergeDrawChannels(ImGuiTable *table)

{
  MergeGroup *this;
  ImU32 *pIVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImRect IVar5;
  char cVar6;
  char cVar7;
  byte bVar8;
  ImDrawListSplitter *pIVar9;
  ImGuiTableColumn *pIVar10;
  ImDrawCmd *pIVar11;
  ImDrawChannel *pIVar12;
  undefined1 auVar13 [16];
  bool bVar14;
  unsigned_short *puVar15;
  int iVar16;
  ImGuiContext *pIVar17;
  ulong uVar18;
  ImBitArray<132> *pIVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int n_2;
  int n;
  long lVar23;
  int n_1;
  ulong uVar24;
  int merge_group_sub_n;
  int iVar25;
  uint uVar26;
  ImDrawChannel *pIVar27;
  uint uVar28;
  ulong uVar29;
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  float fVar33;
  undefined1 auVar34 [40];
  undefined8 uVar37;
  undefined8 uVar38;
  undefined1 auVar35 [64];
  ImRect IVar39;
  ImRect IVar40;
  ImBitArray<132> remaining_mask;
  MergeGroup merge_groups [4];
  undefined1 auVar36 [20];
  
  pIVar17 = GImGui;
  cVar6 = table->FreezeRowsCount;
  cVar7 = table->FreezeColumnsCount;
  pIVar9 = table->DrawSplitter;
  auVar35 = ZEXT1664(ZEXT816(0) << 0x40);
  merge_groups[3].ClipRect.Max.x = 0.0;
  merge_groups[3].ClipRect.Max.y = 0.0;
  merge_groups[3].ChannelsCount = 0;
  merge_groups[3].ChannelsMask.Storage[0] = 0;
  merge_groups[3].ChannelsMask.Storage[1] = 0;
  merge_groups[3].ChannelsMask.Storage[2] = 0;
  merge_groups[3].ChannelsMask.Storage[3] = 0;
  merge_groups[3].ChannelsMask.Storage[4] = 0;
  merge_groups._64_32_ = ZEXT1632(ZEXT816(0) << 0x40);
  merge_groups[2].ChannelsCount = 0;
  merge_groups[2].ChannelsMask.Storage[0] = 0;
  merge_groups[2].ChannelsMask.Storage[1] = 0;
  merge_groups[2].ChannelsMask.Storage[2] = 0;
  merge_groups[2].ChannelsMask.Storage[3] = 0;
  merge_groups[2].ChannelsMask.Storage[4] = 0;
  merge_groups[3].ClipRect.Min.x = 0.0;
  merge_groups[3].ClipRect.Min.y = 0.0;
  auVar34 = auVar35._0_40_;
  auVar36 = auVar34._20_20_;
  uVar37 = SUB168(auVar34._0_16_,0);
  uVar38 = SUB168(auVar34._0_16_,8);
  merge_groups[0].ClipRect.Min.x = (float)(int)uVar37;
  merge_groups[0].ClipRect.Min.y = (float)(int)((ulong)uVar37 >> 0x20);
  merge_groups[0].ClipRect.Max.x = (float)(int)uVar38;
  merge_groups[0].ClipRect.Max.y = (float)(int)((ulong)uVar38 >> 0x20);
  merge_groups[0].ChannelsCount = auVar34._16_4_;
  merge_groups[0].ChannelsMask.Storage[0] = auVar36._0_4_;
  merge_groups[0].ChannelsMask.Storage[1] = auVar36._4_4_;
  merge_groups[0].ChannelsMask.Storage[2] = auVar36._8_4_;
  merge_groups[0].ChannelsMask.Storage[3] = auVar36._12_4_;
  merge_groups[0].ChannelsMask.Storage[4] = auVar36._16_4_;
  uVar37 = SUB168(auVar35._40_16_,0);
  uVar38 = SUB168(auVar35._40_16_,8);
  merge_groups[1].ClipRect.Min.x = (float)(int)uVar37;
  merge_groups[1].ClipRect.Min.y = (float)(int)((ulong)uVar37 >> 0x20);
  merge_groups[1].ClipRect.Max.x = (float)(int)uVar38;
  merge_groups[1].ClipRect.Max.y = (float)(int)((ulong)uVar38 >> 0x20);
  merge_groups[1].ChannelsCount = auVar35._56_4_;
  merge_groups[1].ChannelsMask.Storage[0] = auVar35._60_4_;
  uVar18 = 0;
  uVar28 = 0;
  do {
    if ((long)table->ColumnsCount <= (long)uVar18) {
      if (uVar28 != 0) {
        ImVector<ImDrawChannel>::resize(&pIVar17->DrawChannelsTempMergeBuffer,pIVar9->_Count + -2);
        pIVar27 = (pIVar17->DrawChannelsTempMergeBuffer).Data;
        remaining_mask.Storage._0_16_ = ZEXT816(0);
        remaining_mask.Storage[4] = 0;
        ImBitArraySetBitRange(remaining_mask.Storage,2,pIVar9->_Count);
        bVar8 = table->Bg2DrawChannelUnfrozen & 0x1f;
        remaining_mask.Storage[table->Bg2DrawChannelUnfrozen >> 5] =
             remaining_mask.Storage[table->Bg2DrawChannelUnfrozen >> 5] &
             (-2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8);
        pIVar19 = &merge_groups[0].ChannelsMask;
        fVar33 = (table->HostClipRect).Min.x;
        fVar2 = (table->HostClipRect).Min.y;
        fVar3 = (table->HostClipRect).Max.x;
        fVar4 = (table->HostClipRect).Max.y;
        iVar25 = (pIVar9->_Count - (uint)('\0' < cVar6)) + -2;
        for (uVar18 = 0; uVar18 != 4; uVar18 = uVar18 + 1) {
          iVar20 = merge_groups[uVar18].ChannelsCount;
          if (iVar20 != 0) {
            IVar5 = merge_groups[uVar18].ClipRect;
            auVar13 = vminss_avx((undefined1  [16])IVar5,ZEXT416((uint)fVar33));
            IVar39.Min.x = auVar13._0_4_;
            uVar37 = SUB128(IVar5._4_12_,4);
            IVar39.Min.y = (float)SUB124(IVar5._4_12_,0);
            IVar39.Max.x = (float)(int)uVar37;
            IVar39.Max.y = (float)(int)((ulong)uVar37 >> 0x20);
            IVar40 = IVar39;
            if ('\0' < cVar7) {
              IVar40 = IVar5;
            }
            if ((uVar18 & 1) != 0) {
              IVar39 = IVar40;
            }
            auVar13 = vmovshdup_avx((undefined1  [16])IVar39);
            auVar13 = vminss_avx(auVar13,ZEXT416((uint)fVar2));
            IVar5 = (ImRect)vinsertps_avx((undefined1  [16])IVar39,auVar13,0x10);
            if (cVar6 < '\x01') {
              IVar39 = IVar5;
            }
            if (uVar18 < 2) {
              IVar39 = IVar5;
            }
            if ((uVar18 & 1) != 0) {
              auVar13 = vshufpd_avx((undefined1  [16])IVar39,(undefined1  [16])IVar39,1);
              uVar37 = vcmpss_avx512f(ZEXT416((uint)fVar3),auVar13,2);
              bVar14 = (bool)((byte)uVar37 & 1);
              auVar31._16_48_ = auVar35._16_48_;
              auVar31._0_16_ = ZEXT416((uint)fVar3);
              auVar35._4_60_ = auVar31._4_60_;
              auVar35._0_4_ = (float)((uint)bVar14 * auVar13._0_4_ + (uint)!bVar14 * (int)fVar3);
              IVar39 = (ImRect)vinsertps_avx((undefined1  [16])IVar39,auVar35._0_16_,0x20);
            }
            if ((1 < uVar18) && ((table->Flags & 0x20000) == 0)) {
              auVar13 = vshufps_avx((undefined1  [16])IVar39,(undefined1  [16])IVar39,0xff);
              uVar37 = vcmpss_avx512f(ZEXT416((uint)fVar4),auVar13,2);
              bVar14 = (bool)((byte)uVar37 & 1);
              auVar32._16_48_ = auVar35._16_48_;
              auVar32._0_16_ = ZEXT416((uint)fVar4);
              auVar35._4_60_ = auVar32._4_60_;
              auVar35._0_4_ = (float)((uint)bVar14 * auVar13._0_4_ + (uint)!bVar14 * (int)fVar4);
              IVar39 = (ImRect)vinsertps_avx((undefined1  [16])IVar39,auVar35._0_16_,0x30);
            }
            for (lVar23 = 0; lVar23 != 5; lVar23 = lVar23 + 1) {
              remaining_mask.Storage[lVar23] =
                   remaining_mask.Storage[lVar23] & ~pIVar19->Storage[lVar23];
            }
            auVar13 = vshufpd_avx((undefined1  [16])IVar39,(undefined1  [16])IVar39,1);
            uVar24 = 0;
            auVar13 = vunpcklpd_avx((undefined1  [16])IVar39,auVar13);
            lVar23 = 8;
            iVar21 = iVar20;
            while (((long)uVar24 < (long)pIVar9->_Count && (iVar21 != 0))) {
              uVar29 = uVar24 >> 5 & 0x7ffffff;
              uVar28 = merge_groups[uVar18].ChannelsMask.Storage[uVar29];
              if ((uVar28 >> ((uint)uVar24 & 0x1f) & 1) != 0) {
                iVar21 = iVar21 + -1;
                merge_groups[uVar18].ChannelsMask.Storage[uVar29] =
                     ~(1 << ((uint)uVar24 & 0x1f)) & uVar28;
                pIVar12 = (pIVar9->_Channels).Data;
                **(undefined1 (**) [16])((long)&(pIVar12->_CmdBuffer).Size + lVar23) = auVar13;
                *pIVar27 = *(ImDrawChannel *)((long)pIVar12 + lVar23 + -8);
                pIVar27 = pIVar27 + 1;
              }
              uVar24 = uVar24 + 1;
              lVar23 = lVar23 + 0x20;
            }
            iVar25 = iVar25 - iVar20;
          }
          if (uVar18 == 1 && '\0' < cVar6) {
            pIVar12 = (pIVar9->_Channels).Data + table->Bg2DrawChannelUnfrozen;
            iVar20 = (pIVar12->_CmdBuffer).Capacity;
            pIVar11 = (pIVar12->_CmdBuffer).Data;
            iVar21 = (pIVar12->_IdxBuffer).Size;
            iVar16 = (pIVar12->_IdxBuffer).Capacity;
            puVar15 = (pIVar12->_IdxBuffer).Data;
            (pIVar27->_CmdBuffer).Size = (pIVar12->_CmdBuffer).Size;
            (pIVar27->_CmdBuffer).Capacity = iVar20;
            (pIVar27->_CmdBuffer).Data = pIVar11;
            (pIVar27->_IdxBuffer).Size = iVar21;
            (pIVar27->_IdxBuffer).Capacity = iVar16;
            (pIVar27->_IdxBuffer).Data = puVar15;
            pIVar27 = pIVar27 + 1;
          }
          pIVar19 = pIVar19 + 2;
        }
        lVar23 = 0;
        uVar18 = 0;
        while (((long)uVar18 < (long)pIVar9->_Count && (iVar25 != 0))) {
          if ((remaining_mask.Storage[uVar18 >> 5 & 0x7ffffff] >> ((uint)uVar18 & 0x1f) & 1) != 0) {
            iVar25 = iVar25 + -1;
            *pIVar27 = *(ImDrawChannel *)
                        ((long)&(((pIVar9->_Channels).Data)->_CmdBuffer).Size + lVar23);
            pIVar27 = pIVar27 + 1;
          }
          uVar18 = uVar18 + 1;
          lVar23 = lVar23 + 0x20;
        }
        memcpy((pIVar9->_Channels).Data + 2,(pIVar17->DrawChannelsTempMergeBuffer).Data,
               (long)pIVar9->_Count * 0x20 - 0x40);
      }
      return;
    }
    if ((table->VisibleMaskByIndex >> (uVar18 & 0x3f) & 1) != 0) {
      pIVar10 = (table->Columns).Data;
      for (iVar25 = 0; ('\0' < cVar6) + 1 != iVar25; iVar25 = iVar25 + 1) {
        pIVar27 = (pIVar9->_Channels).Data;
        bVar8 = *(byte *)((long)pIVar10 + (0x59 - (ulong)(iVar25 == 0)) + uVar18 * 0x68);
        iVar20 = pIVar27[bVar8]._CmdBuffer.Size;
        if (0 < (long)iVar20) {
          pIVar27 = pIVar27 + bVar8;
          pIVar11 = (pIVar27->_CmdBuffer).Data;
          if (pIVar11[(long)iVar20 + -1].ElemCount == 0) {
            iVar20 = iVar20 + -1;
            (pIVar27->_CmdBuffer).Size = iVar20;
          }
          if (iVar20 == 1) {
            if ((pIVar10[uVar18].Flags & 0x100) == 0) {
              if (cVar6 < '\x01') {
                fVar33 = pIVar10[uVar18].ContentMaxXUnfrozen;
LAB_0027b535:
                fVar2 = pIVar10[uVar18].ContentMaxXHeadersUsed;
                uVar37 = vcmpss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)fVar33),2);
                bVar14 = (bool)((byte)uVar37 & 1);
                auVar30._16_48_ = auVar35._16_48_;
                auVar30._0_16_ = ZEXT416((uint)fVar2);
                auVar35._4_60_ = auVar30._4_60_;
                auVar35._0_4_ = (float)((uint)bVar14 * (int)fVar33 + (uint)!bVar14 * (int)fVar2);
                fVar33 = auVar35._0_4_;
              }
              else {
                if (iVar25 == 0) {
                  fVar33 = pIVar10[uVar18].ContentMaxXFrozen;
                  goto LAB_0027b535;
                }
                fVar33 = pIVar10[uVar18].ContentMaxXUnfrozen;
              }
              if (pIVar10[uVar18].ClipRect.Max.x < fVar33) goto LAB_0027b5e3;
            }
            uVar26 = 1;
            if ('\0' < cVar7) {
              uVar26 = (uint)((long)table->FreezeColumnsCount <= (long)uVar18);
            }
            uVar22 = (uint)(iVar25 != 0) * 2;
            if (cVar6 < '\x01') {
              uVar22 = 2;
            }
            uVar22 = uVar22 | uVar26;
            this = merge_groups + uVar22;
            iVar20 = merge_groups[uVar22].ChannelsCount;
            if (iVar20 == 0) {
              (this->ClipRect).Min.x = 3.4028235e+38;
              (this->ClipRect).Min.y = 3.4028235e+38;
              merge_groups[uVar22].ClipRect.Max.x = -3.4028235e+38;
              merge_groups[uVar22].ClipRect.Max.y = -3.4028235e+38;
            }
            pIVar1 = merge_groups[uVar22].ChannelsMask.Storage + (bVar8 >> 5);
            *pIVar1 = *pIVar1 | 1 << (bVar8 & 0x1f);
            merge_groups[uVar22].ChannelsCount = iVar20 + 1;
            remaining_mask.Storage._0_16_ = pIVar11->ClipRect;
            ImRect::Add(&this->ClipRect,(ImRect *)&remaining_mask);
            uVar28 = uVar28 | 1 << uVar22;
          }
        }
LAB_0027b5e3:
      }
      pIVar10[uVar18].DrawChannelCurrent = 0xff;
    }
    uVar18 = uVar18 + 1;
  } while( true );
}

Assistant:

void ImGui::TableMergeDrawChannels(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = table->DrawSplitter;
    const bool has_freeze_v = (table->FreezeRowsCount > 0);
    const bool has_freeze_h = (table->FreezeColumnsCount > 0);
    IM_ASSERT(splitter->_Current == 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;

        MergeGroup() { ChannelsCount = 0; }
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if ((table->VisibleMaskByIndex & ((ImU64)1 << column_n)) == 0)
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = has_freeze_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelFrozen : column->DrawChannelUnfrozen;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0)
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column
            // (note that we assume that rendering didn't stray on the left direction. we should need a CursorMinPos to detect it)
            if (!(column->Flags & ImGuiTableColumnFlags_NoClip))
            {
                float content_max_x;
                if (!has_freeze_v)
                    content_max_x = ImMax(column->ContentMaxXUnfrozen, column->ContentMaxXHeadersUsed); // No row freeze
                else if (merge_group_sub_n == 0)
                    content_max_x = ImMax(column->ContentMaxXFrozen, column->ContentMaxXHeadersUsed);   // Row freeze: use width before freeze
                else
                    content_max_x = column->ContentMaxXUnfrozen;                                        // Row freeze: use width after freeze
                if (content_max_x > column->ClipRect.Max.x)
                    continue;
            }

            const int merge_group_n = (has_freeze_h && column_n < table->FreezeColumnsCount ? 0 : 1) + (has_freeze_v && merge_group_sub_n == 0 ? 0 : 2);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_n);
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelFrozen/DrawChannelUnfrozen solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = (ImGuiTableDrawChannelIdx)-1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // We skip channel 0 (Bg0/Bg1) and 1 (Bg2 frozen) from the shuffling since they won't move - see channels allocation in TableSetupDrawChannels().
        const int LEADING_DRAW_CHANNELS = 2;
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - LEADING_DRAW_CHANNELS); // Use shared temporary storage so the allocation gets amortized
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask;                       // We need 132-bit of storage
        remaining_mask.SetBitRange(LEADING_DRAW_CHANNELS, splitter->_Count);
        remaining_mask.ClearBit(table->Bg2DrawChannelUnfrozen);
        IM_ASSERT(has_freeze_v == false || table->Bg2DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG2_FROZEN);
        int remaining_count = splitter->_Count - (has_freeze_v ? LEADING_DRAW_CHANNELS + 1 : LEADING_DRAW_CHANNELS);
        //ImRect host_rect = (table->InnerWindow == table->OuterWindow) ? table->InnerClipRect : table->HostClipRect;
        ImRect host_rect = table->HostClipRect;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_group->ClipRect;

                // Extend outer-most clip limits to match those of host, so draw calls can be merged even if
                // outer-most columns have some outer padding offsetting them from their parent ClipRect.
                // The principal cases this is dealing with are:
                // - On a same-window table (not scrolling = single group), all fitting columns ClipRect -> will extend and match host ClipRect -> will merge
                // - Columns can use padding and have left-most ClipRect.Min.x and right-most ClipRect.Max.x != from host ClipRect -> will extend and match host ClipRect -> will merge
                // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column doesn't fit
                // within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect.
                if ((merge_group_n & 1) == 0 || !has_freeze_h)
                    merge_clip_rect.Min.x = ImMin(merge_clip_rect.Min.x, host_rect.Min.x);
                if ((merge_group_n & 2) == 0 || !has_freeze_v)
                    merge_clip_rect.Min.y = ImMin(merge_clip_rect.Min.y, host_rect.Min.y);
                if ((merge_group_n & 1) != 0)
                    merge_clip_rect.Max.x = ImMax(merge_clip_rect.Max.x, host_rect.Max.x);
                if ((merge_group_n & 2) != 0 && (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0)
                    merge_clip_rect.Max.y = ImMax(merge_clip_rect.Max.y, host_rect.Max.y);
#if 0
                GetOverlayDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, 0, 1.0f);
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Min, merge_clip_rect.Min, IM_COL32(255, 100, 0, 200));
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Max, merge_clip_rect.Max, IM_COL32(255, 100, 0, 200));
#endif
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

            // Make sure Bg2DrawChannelUnfrozen appears in the middle of our groups (whereas Bg0/Bg1 and Bg2 frozen are fixed to 0 and 1)
            if (merge_group_n == 1 && has_freeze_v)
                memcpy(dst_tmp++, &splitter->_Channels[table->Bg2DrawChannelUnfrozen], sizeof(ImDrawChannel));
        }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + LEADING_DRAW_CHANNELS, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - LEADING_DRAW_CHANNELS) * sizeof(ImDrawChannel));
    }
}